

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::readWords(CollationRuleParser *this,int32_t i,UnicodeString *raw)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *this_00;
  UBool UVar3;
  ushort uVar4;
  char16_t srcChar;
  int32_t offset;
  __off_t __length;
  int32_t iVar5;
  uint c;
  ConstChar16Ptr local_40;
  UChar *local_38;
  
  uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = 2;
  if ((uVar1 & 1) == 0) {
    uVar4 = uVar1 & 0x1e;
  }
  (raw->fUnion).fStackFields.fLengthAndFlags = uVar4;
  offset = skipWhiteSpace(this,i);
  while( true ) {
    this_00 = this->rules;
    sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    if (iVar5 <= offset) break;
    srcChar = UnicodeString::doCharAt(this_00,offset);
    c = (uint)(ushort)srcChar;
    UVar3 = isSyntaxChar(c);
    if (((UVar3 != '\0') && (srcChar != L'-')) && (c != 0x5f)) {
      if (0x1f < (ushort)(raw->fUnion).fStackFields.fLengthAndFlags) {
        local_40.p_ = 
        L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥Evariable top"
        ;
        UVar3 = UnicodeString::endsWith(raw,&local_40,1);
        local_38 = local_40.p_;
        if (UVar3 != '\0') {
          sVar2 = (raw->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar5 = (raw->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar2 >> 5;
          }
          UnicodeString::truncate(raw,(char *)(ulong)(iVar5 - 1),__length);
        }
      }
      return offset;
    }
    UVar3 = PatternProps::isWhiteSpace(c);
    offset = offset + 1;
    if (UVar3 == '\0') {
      UnicodeString::append(raw,srcChar);
    }
    else {
      UnicodeString::append(raw,L' ');
      offset = skipWhiteSpace(this,offset);
    }
  }
  return 0;
}

Assistant:

int32_t
CollationRuleParser::readWords(int32_t i, UnicodeString &raw) const {
    static const UChar sp = 0x20;
    raw.remove();
    i = skipWhiteSpace(i);
    for(;;) {
        if(i >= rules->length()) { return 0; }
        UChar c = rules->charAt(i);
        if(isSyntaxChar(c) && c != 0x2d && c != 0x5f) {  // syntax except -_
            if(raw.isEmpty()) { return i; }
            if(raw.endsWith(&sp, 1)) {  // remove trailing space
                raw.truncate(raw.length() - 1);
            }
            return i;
        }
        if(PatternProps::isWhiteSpace(c)) {
            raw.append(sp);
            i = skipWhiteSpace(i + 1);
        } else {
            raw.append(c);
            ++i;
        }
    }
}